

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_partial_sig_load
              (secp256k1_context *ctx,secp256k1_scalar *s,secp256k1_musig_partial_sig *sig)

{
  int iVar1;
  int overflow;
  
  iVar1 = secp256k1_memcmp_var(sig,secp256k1_musig_partial_sig_magic,4);
  if (iVar1 != 0) {
    (*(ctx->illegal_callback).fn)
              ("secp256k1_memcmp_var(&sig->data[0], secp256k1_musig_partial_sig_magic, 4) == 0",
               (ctx->illegal_callback).data);
  }
  else {
    secp256k1_scalar_set_b32(s,sig->data + 4,&overflow);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

static int secp256k1_musig_partial_sig_load(const secp256k1_context* ctx, secp256k1_scalar *s, const secp256k1_musig_partial_sig* sig) {
    int overflow;

    ARG_CHECK(secp256k1_memcmp_var(&sig->data[0], secp256k1_musig_partial_sig_magic, 4) == 0);
    secp256k1_scalar_set_b32(s, &sig->data[4], &overflow);
    /* Parsed signatures can not overflow */
    VERIFY_CHECK(!overflow);
    return 1;
}